

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::detail::
Dynamic_Caster<chaiscript::dispatch::Proxy_Function_Base,_chaiscript::dispatch::Assignable_Proxy_Function>
::cast(Dynamic_Caster<chaiscript::dispatch::Proxy_Function_Base,_chaiscript::dispatch::Assignable_Proxy_Function>
       *this,Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  reference_wrapper<chaiscript::dispatch::Assignable_Proxy_Function> obj;
  reference_wrapper<const_chaiscript::dispatch::Assignable_Proxy_Function> obj_00;
  bool bVar7;
  Proxy_Function_Base *pPVar8;
  long lVar9;
  undefined8 *puVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar12;
  Boxed_Value BVar13;
  undefined1 in_stack_ffffffffffffffcf;
  shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function> local_30;
  uint uVar14;
  undefined4 in_stack_ffffffffffffffe4;
  
  local_30.
  super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&dispatch::Proxy_Function_Base::typeinfo;
  local_30.
  super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&dispatch::Proxy_Function_Base::typeinfo;
  uVar14 = 0;
  bVar7 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(Type_Info *)&local_30);
  if (!bVar7) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x38);
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar3 = *(undefined8 *)&(peVar2->m_type_info).m_flags;
    uVar4 = *(undefined4 *)((long)&(peVar2->m_type_info).m_type_info + 4);
    uVar5 = *(undefined4 *)&(peVar2->m_type_info).m_bare_type_info;
    uVar6 = *(undefined4 *)((long)&(peVar2->m_type_info).m_bare_type_info + 4);
    *(undefined4 *)(puVar10 + 1) = *(undefined4 *)&(peVar2->m_type_info).m_type_info;
    *(undefined4 *)((long)puVar10 + 0xc) = uVar4;
    *(undefined4 *)(puVar10 + 2) = uVar5;
    *(undefined4 *)((long)puVar10 + 0x14) = uVar6;
    puVar10[3] = uVar3;
    puVar10[4] = &dispatch::Assignable_Proxy_Function::typeinfo;
    puVar10[5] = 0x1f;
    puVar10[6] = "Unknown dynamic_cast_conversion";
    *puVar10 = &PTR__bad_cast_004a3548;
    __cxa_throw(puVar10,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                std::bad_cast::~bad_cast);
  }
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if (peVar2->m_is_ref == false) {
    if ((uVar1 & 1) == 0) {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_30);
      Boxed_Value::Object_Data::get<chaiscript::dispatch::Assignable_Proxy_Function>
                ((Object_Data *)this,&local_30,false);
    }
    else {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)&local_30);
      Boxed_Value::Object_Data::get<chaiscript::dispatch::Assignable_Proxy_Function_const>
                ((Object_Data *)this,
                 (shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *)&local_30,
                 false);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.
                super___shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    _Var11._M_pi = extraout_RDX;
  }
  else if ((uVar1 & 1) == 0) {
    pPVar8 = Cast_Helper_Inner<chaiscript::dispatch::Proxy_Function_Base_&>::cast
                       (t_from,(Type_Conversions_State *)0x0);
    lVar9 = __dynamic_cast(pPVar8,&dispatch::Proxy_Function_Base::typeinfo,
                           &dispatch::Assignable_Proxy_Function::typeinfo,0);
    if (lVar9 == 0) {
LAB_003bcd7c:
      __cxa_bad_cast();
    }
    obj._M_data._4_4_ = in_stack_ffffffffffffffe4;
    obj._M_data._0_4_ = uVar14;
    sVar12 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Assignable_Proxy_Function>
                       (obj,(bool)in_stack_ffffffffffffffcf);
    _Var11 = sVar12.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  else {
    pPVar8 = Cast_Helper_Inner<const_chaiscript::dispatch::Proxy_Function_Base_&>::cast
                       (t_from,(Type_Conversions_State *)0x0);
    lVar9 = __dynamic_cast(pPVar8,&dispatch::Proxy_Function_Base::typeinfo,
                           &dispatch::Assignable_Proxy_Function::typeinfo,0);
    if (lVar9 == 0) goto LAB_003bcd7c;
    obj_00._M_data._4_4_ = in_stack_ffffffffffffffe4;
    obj_00._M_data._0_4_ = uVar14;
    sVar12 = Boxed_Value::Object_Data::get<chaiscript::dispatch::Assignable_Proxy_Function_const>
                       (obj_00,(bool)in_stack_ffffffffffffffcf);
    _Var11 = sVar12.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  BVar13.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var11._M_pi;
  BVar13.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar13.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from) {
        if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>())) {
          if (t_from.is_pointer()) {
            // Dynamic cast out the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              return Boxed_Value([&]() {
                if (auto data
                    = std::dynamic_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
                  throw std::bad_cast();
                }
              }());
            } else {
              return Boxed_Value([&]() {
                if (auto data = std::dynamic_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr))) {
                  return data;
                } else {
#ifdef CHAISCRIPT_LIBCPP
                  /// \todo fix this someday after libc++ is fixed.
                  if (std::string(typeid(To).name()).find("Assignable_Proxy_Function") != std::string::npos) {
                    auto from = detail::Cast_Helper<std::shared_ptr<From>>::cast(t_from, nullptr);
                    if (std::string(typeid(*from).name()).find("Assignable_Proxy_Function_Impl") != std::string::npos) {
                      return std::static_pointer_cast<To>(from);
                    }
                  }
#endif
                  throw std::bad_cast();
                }
              }());
            }
          } else {
            // Pull the reference out of the contained boxed value, which we know is the type we want
            if (t_from.is_const()) {
              const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
              const To &data = dynamic_cast<const To &>(d);
              return Boxed_Value(std::cref(data));
            } else {
              From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
              To &data = dynamic_cast<To &>(d);
              return Boxed_Value(std::ref(data));
            }
          }
        } else {
          throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
        }
      }